

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finitediff.cpp
# Opt level: O0

bool fd::compare_jacobian
               (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *x,
               Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *y,
               double test_eps,string *msg)

{
  long lVar1;
  string *psVar2;
  Index IVar3;
  double *pdVar4;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *pRVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  format_string_t<const_std::__cxx11::basic_string<char>_&,_const_double_&,_long_&,_long_&,_double,_double,_double_&,_double,_double>
  fmt;
  double *in_stack_fffffffffffffef0;
  double local_d0;
  double local_c8;
  CoeffReturnType local_c0;
  CoeffReturnType local_b8;
  spdlog *local_b0;
  char *local_a8;
  double local_a0;
  double abs_diff;
  double local_90;
  double local_88;
  double local_80;
  double scale;
  long j;
  long i;
  string *psStack_60;
  bool same;
  string *msg_local;
  double test_eps_local;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *y_local;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *x_local;
  spdlog **local_38;
  char *local_30;
  spdlog **local_28;
  Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *local_20;
  
  i._7_1_ = 1;
  j = 0;
  psStack_60 = msg;
  msg_local = (string *)test_eps;
  test_eps_local = (double)y;
  y_local = x;
  while( true ) {
    lVar1 = j;
    IVar3 = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
            ::rows((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)y_local);
    if (IVar3 <= lVar1) break;
    scale = 0.0;
    while( true ) {
      dVar6 = scale;
      IVar3 = Eigen::
              MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
              ::cols((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)y_local);
      if (IVar3 <= (long)dVar6) break;
      pRVar5 = y_local;
      Eigen::
      DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)y_local,j,(Index)scale);
      std::abs((int)pRVar5);
      dVar6 = test_eps_local;
      Eigen::
      DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)test_eps_local,j,(Index)scale);
      std::abs(SUB84(dVar6,0));
      pdVar4 = std::max<double>(&local_88,&local_90);
      abs_diff = 1.0;
      pdVar4 = std::max<double>(pdVar4,&abs_diff);
      local_80 = *pdVar4;
      Eigen::
      DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)y_local,j,(Index)scale);
      dVar6 = test_eps_local;
      Eigen::
      DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
      ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    *)test_eps_local,j,(Index)scale);
      std::abs(SUB84(dVar6,0));
      if ((double)msg_local * local_80 < extraout_XMM0_Qa) {
        local_38 = &local_b0;
        x_local = (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *
                  )anon_var_dwarf_144695;
        local_30 = 
        "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} |x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}";
        local_b0 = (spdlog *)0x28edd6;
        local_a0 = extraout_XMM0_Qa;
        local_28 = local_38;
        local_a8 = (char *)std::char_traits<char>::length
                                     (
                                     "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} |x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}"
                                     );
        psVar2 = psStack_60;
        local_20 = x_local;
        local_b8 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                 *)y_local,j,(Index)scale);
        local_c0 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                 *)test_eps_local,j,(Index)scale);
        dVar6 = local_a0;
        pRVar5 = y_local;
        Eigen::
        DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
        ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)y_local,j,(Index)scale);
        std::abs((int)pRVar5);
        local_c8 = dVar6 / extraout_XMM0_Qa_00;
        dVar6 = test_eps_local;
        Eigen::
        DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
        ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      *)test_eps_local,j,(Index)scale);
        std::abs(SUB84(dVar6,0));
        local_d0 = local_a0 / extraout_XMM0_Qa_01;
        fmt.str_.size_ = (size_t)psVar2;
        fmt.str_.data_ = local_a8;
        spdlog::
        debug<std::__cxx11::string_const&,double_const&,long&,long&,double,double,double&,double,double>
                  (local_b0,fmt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg_local,
                   (double *)&j,(long *)&scale,(long *)&local_b8,&local_c0,&local_a0,&local_c8,
                   &local_d0,in_stack_fffffffffffffef0);
        i._7_1_ = 0;
      }
      scale = (double)((long)scale + 1);
    }
    j = j + 1;
  }
  return (bool)(i._7_1_ & 1);
}

Assistant:

bool compare_jacobian(
    const Eigen::Ref<const Eigen::MatrixXd>& x,
    const Eigen::Ref<const Eigen::MatrixXd>& y,
    const double test_eps,
    const std::string& msg)
{
    assert(x.rows() == y.rows());
    assert(x.cols() == y.cols());

    bool same = true;
    for (long i = 0; i < x.rows(); i++) {
        for (long j = 0; j < x.cols(); j++) {
            double scale = std::max(
                std::max(std::abs(x(i, j)), std::abs(y(i, j))), double(1.0));

            double abs_diff = std::abs(x(i, j) - y(i, j));

            if (abs_diff > test_eps * scale) {
                spdlog::debug(
                    "{} eps={:.3e} r={} c={} x={:.3e} y={:.3e} "
                    "|x-y|={:.3e} |x-y|/|x|={:.3e} |x-y|/|y|={:3e}",
                    msg, test_eps, i, j, x(i, j), y(i, j), abs_diff,
                    abs_diff / std::abs(x(i, j)), abs_diff / std::abs(y(i, j)));
                same = false;
            }
        }
    }
    return same;
}